

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitPropertyStringMap(ScriptContext *this,int i)

{
  Recycler *alloc;
  PropertyStringMap *ptr;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&PropertyStringMap::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x652;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  ptr = (PropertyStringMap *)new<Memory::Recycler>(0x280,alloc,0x37a1d4);
  memset(ptr,0,0x280);
  Memory::WriteBarrierPtr<Js::PropertyStringMap>::WriteBarrierSet
            ((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings + i,ptr);
  memset((((this->super_ScriptContextBase).javascriptLibrary)->cache).propertyStrings[i].ptr,0,0x280
        );
  return;
}

Assistant:

void ScriptContext::InitPropertyStringMap(int i)
    {
        this->Cache()->propertyStrings[i] = RecyclerNewStruct(GetRecycler(), PropertyStringMap);
        ClearArray(this->Cache()->propertyStrings[i]->strLen2, 80);
    }